

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder_optimum_normal.c
# Opt level: O3

void lzma_lzma_optimum_normal
               (lzma_lzma1_encoder *coder,lzma_mf *mf,uint32_t *back_res,uint32_t *len_res,
               uint32_t position)

{
  uint32_t *puVar1;
  lzma_lzma_state *plVar2;
  byte bVar3;
  byte bVar4;
  short sVar5;
  ushort uVar6;
  ushort uVar7;
  uint8_t *puVar8;
  ulong uVar9;
  undefined8 uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  short *psVar13;
  sbyte sVar14;
  int iVar15;
  uint32_t *puVar16;
  uint32_t *puVar17;
  lzma_lzma_state lVar18;
  uint32_t price;
  int iVar19;
  ulong uVar20;
  byte bVar21;
  uint32_t uVar22;
  uint uVar23;
  uint uVar24;
  lzma_lzma_state lVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  undefined4 in_register_00000084;
  int iVar29;
  long lVar30;
  ulong uVar31;
  short *psVar32;
  short *psVar33;
  uint uVar34;
  long lVar35;
  short *psVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  uint uVar40;
  uint32_t model_index;
  uint uVar41;
  ulong uVar42;
  bool bVar43;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  int iVar56;
  undefined1 auVar55 [16];
  int iVar58;
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint32_t reps [4];
  uint32_t matches_count;
  ulong local_1a8;
  ulong local_168;
  uint local_148 [3];
  uint32_t uStack_13c;
  uint32_t *local_130;
  uint *local_128;
  long local_120;
  uint local_114;
  uint local_110;
  uint local_10c;
  ulong local_108;
  uint32_t *local_100;
  ulong local_f8;
  uint local_ec;
  probability (*local_e8) [16];
  uint32_t (*local_e0) [272];
  ulong local_d8;
  uint32_t (*local_d0) [272];
  ulong local_c8;
  uint32_t *local_c0;
  probability (*local_b8) [16];
  undefined8 local_b0;
  ulong local_a8;
  lzma_match *local_a0;
  uint8_t *local_98;
  uint32_t (*local_90) [272];
  uint32_t local_88;
  uint local_84;
  ulong local_80;
  ulong local_78;
  uint32_t *local_70;
  uint32_t *local_68;
  ulong local_60;
  probability *local_58;
  long local_50;
  ulong local_48;
  uint32_t (*local_40) [128];
  uint32_t (*local_38) [64];
  
  local_b0 = CONCAT44(in_register_00000084,position);
  uVar34 = coder->opts_current_index;
  uVar11 = mf->read_ahead;
  local_130 = back_res;
  local_128 = len_res;
  if (coder->opts_end_index != uVar34) {
    if (uVar11 == 0) {
      __assert_fail("mf->read_ahead > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x327,
                    "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar11 = coder->opts[uVar34].pos_prev;
    uVar22 = coder->opts[uVar34].back_prev;
    coder->opts_current_index = uVar11;
    *len_res = uVar11 - uVar34;
LAB_00414020:
    *local_130 = uVar22;
    return;
  }
  if (uVar11 == 0) {
    if (0x7f < coder->match_price_count) {
      puVar17 = coder->dist_slot_prices[0] + 0xe;
      lVar30 = 0;
      do {
        puVar16 = coder->dist_slot_prices[lVar30];
        if (coder->dist_table_size != 0) {
          uVar20 = 0;
          do {
            uVar22 = 0;
            uVar34 = (int)uVar20 + 0x40;
            do {
              uVar40 = uVar34 >> 1;
              uVar22 = uVar22 + lzma_rc_prices
                                [(-(uVar34 & 1) & 0x7f0 ^
                                 (uint)*(ushort *)
                                        ((long)coder->dist_slot[lVar30] +
                                        (ulong)(uVar34 & 0xfffffffe))) >> 4];
              uVar34 = uVar40;
            } while (uVar40 != 1);
            puVar16[uVar20] = uVar22;
            uVar20 = uVar20 + 1;
          } while (uVar20 < coder->dist_table_size);
          if (0xe < coder->dist_table_size) {
            uVar34 = 0x70;
            lVar35 = 0;
            do {
              puVar17[lVar35] = (puVar17[lVar35] + (uVar34 & 0xfffffff0)) - 0x50;
              uVar20 = lVar35 + 0xf;
              uVar34 = uVar34 + 8;
              lVar35 = lVar35 + 1;
            } while (uVar20 < coder->dist_table_size);
          }
        }
        uVar10 = *(undefined8 *)(puVar16 + 2);
        puVar1 = coder->dist_prices[lVar30];
        *(undefined8 *)puVar1 = *(undefined8 *)puVar16;
        *(undefined8 *)(puVar1 + 2) = uVar10;
        lVar30 = lVar30 + 1;
        puVar17 = puVar17 + 0x40;
      } while (lVar30 != 4);
      puVar17 = coder->dist_prices[0] + 4;
      lVar30 = 4;
      do {
        bVar3 = ""[lVar30];
        iVar15 = (bVar3 >> 1) - 1;
        bVar21 = (byte)iVar15 & 0x1f;
        uVar40 = (bVar3 & 1 | 2) << bVar21;
        uVar23 = (int)lVar30 - uVar40;
        uVar34 = 1;
        iVar19 = 0 << bVar21;
        do {
          uVar37 = uVar23 & 1;
          uVar20 = (ulong)uVar34;
          uVar34 = uVar37 + uVar34 * 2;
          uVar23 = uVar23 >> 1;
          iVar19 = iVar19 + (uint)lzma_rc_prices
                                  [(-uVar37 & 0x7f0 ^
                                   (uint)*(ushort *)
                                          ((long)coder +
                                          uVar20 * 2 +
                                          ((ulong)uVar40 * 2 - (ulong)((uint)bVar3 + (uint)bVar3)) +
                                          0x70fa)) >> 4];
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        lVar35 = 0;
        do {
          *(int *)((long)puVar17 + lVar35 * 2) =
               *(int *)((long)coder->dist_slot_prices[0] + lVar35 + (ulong)bVar3 * 4) + iVar19;
          lVar35 = lVar35 + 0x100;
        } while (lVar35 != 0x400);
        lVar30 = lVar30 + 1;
        puVar17 = puVar17 + 1;
      } while (lVar30 != 0x80);
      coder->match_price_count = 0;
    }
    if (0xf < coder->align_price_count) {
      uVar20 = 0;
      do {
        uVar34 = 1;
        iVar15 = -4;
        uVar31 = uVar20 & 0xffffffff;
        uVar22 = 0;
        do {
          uVar40 = (uint)uVar31 & 1;
          uVar42 = (ulong)uVar34;
          uVar34 = uVar40 + uVar34 * 2;
          uVar31 = uVar31 >> 1;
          uVar22 = uVar22 + lzma_rc_prices[(-uVar40 & 0x7f0 ^ (uint)coder->dist_align[uVar42]) >> 4]
          ;
          iVar15 = iVar15 + 1;
        } while (iVar15 != 0);
        coder->align_prices[uVar20] = uVar22;
        uVar20 = uVar20 + 1;
      } while (uVar20 != 0x10);
      coder->align_price_count = 0;
    }
  }
  uVar34 = mf->nice_len;
  if (uVar11 == 1) {
    local_10c = coder->matches_count;
    uVar40 = coder->longest_match_length;
  }
  else {
    if (uVar11 != 0) {
      __assert_fail("mf->read_ahead == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                    ,0x11c,
                    "uint32_t helper1(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                   );
    }
    uVar40 = lzma_mf_find(mf,&local_10c,coder->matches);
  }
  uVar20 = (ulong)mf->read_pos;
  uVar37 = (mf->write_pos - mf->read_pos) + 1;
  uVar23 = 0x111;
  if ((0x110 < uVar37) || (uVar23 = uVar37, 1 < uVar37)) {
    puVar8 = mf->buffer;
    puVar17 = coder->reps;
    sVar5 = *(short *)(puVar8 + (uVar20 - 1));
    lVar30 = 0;
    uVar37 = 0;
    do {
      if (sVar5 == *(short *)(puVar8 + (uVar20 - 2) + -(ulong)puVar17[lVar30])) {
        uVar24 = uVar23;
        if (2 < uVar23) {
          uVar31 = 2;
LAB_004140b9:
          uVar42 = *(long *)(puVar8 + uVar31 + (uVar20 - 1)) -
                   *(long *)(puVar8 + uVar31 + (uVar20 - puVar17[lVar30]) + -2);
          if (uVar42 == 0) goto code_r0x004140c5;
          uVar9 = 0;
          if (uVar42 != 0) {
            for (; (uVar42 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
            }
          }
          uVar24 = (int)uVar31 + ((uint)(uVar9 >> 3) & 0x1fffffff);
          if (uVar23 <= uVar24) {
            uVar24 = uVar23;
          }
        }
LAB_004140f3:
        local_148[lVar30] = uVar24;
        if (local_148[uVar37] < uVar24) {
          uVar37 = (uint)lVar30;
        }
      }
      else {
        local_148[lVar30] = 0;
      }
      lVar30 = lVar30 + 1;
    } while (lVar30 != 4);
    uVar23 = local_148[uVar37];
    if (uVar34 <= uVar23) {
      *local_130 = uVar37;
      *local_128 = uVar23;
      uVar11 = uVar23 - 1;
      if (uVar11 == 0) {
        return;
      }
      (*mf->skip)(mf,uVar11);
      mf->read_ahead = mf->read_ahead + uVar11;
      return;
    }
    if (uVar34 <= uVar40) {
      *local_130 = coder->matches[local_10c - 1].dist + 4;
      *local_128 = uVar40;
      uVar11 = uVar40 - 1;
      if (uVar11 == 0) {
        return;
      }
      (*mf->skip)(mf,uVar11);
      mf->read_ahead = mf->read_ahead + uVar11;
      return;
    }
    bVar3 = puVar8[~(ulong)*puVar17 + (uVar20 - 1)];
    bVar21 = (byte)sVar5;
    if (((1 < uVar23) || (1 < uVar40)) || (bVar3 == bVar21)) {
      uVar31 = (ulong)coder->state;
      coder->opts[0].state = coder->state;
      uVar34 = coder->pos_mask & (uint)local_b0;
      uVar42 = (ulong)(coder->is_match[uVar31][uVar34] >> 4);
      local_90 = (uint32_t (*) [272])CONCAT44(local_90._4_4_,(uint)lzma_rc_prices[uVar42]);
      uVar11 = get_literal_price(coder,(uint)local_b0,(uint)puVar8[uVar20 - 2],6 < uVar31,
                                 (uint)bVar3,(uint)bVar21);
      coder->opts[1].price = uVar11 + (int)local_90;
      coder->opts[1].back_prev = 0xffffffff;
      coder->opts[1].prev_1_is_literal = false;
      bVar4 = lzma_rc_prices[uVar42 ^ 0x7f];
      uVar20 = (ulong)(coder->is_rep[uVar31] >> 4);
      iVar15 = (uint)lzma_rc_prices[uVar20 ^ 0x7f] + (uint)bVar4;
      uVar22 = 0xffffffff;
      if ((bVar3 == bVar21) &&
         (uVar37 = (uint)lzma_rc_prices[coder->is_rep0_long[uVar31][uVar34] >> 4] +
                   (uint)lzma_rc_prices[coder->is_rep0[uVar31] >> 4] + iVar15,
         uVar37 < uVar11 + (int)local_90)) {
        coder->opts[1].price = uVar37;
        coder->opts[1].back_prev = 0;
        uVar22 = 0;
      }
      if (uVar23 < uVar40) {
        uVar23 = uVar40;
      }
      local_1a8 = (ulong)uVar23;
      if (1 < uVar23) {
        local_e8 = coder->is_match;
        coder->opts[1].pos_prev = 0;
        local_c0 = coder->opts[0].backs;
        uVar10 = *(undefined8 *)(coder->reps + 2);
        *(undefined8 *)coder->opts[0].backs = *(undefined8 *)coder->reps;
        *(undefined8 *)(coder->opts[0].backs + 2) = uVar10;
        auVar61 = _DAT_004efa70;
        auVar60 = _DAT_004efa60;
        auVar59 = _DAT_004efa50;
        uVar37 = uVar23 - 2;
        auVar45._4_4_ = 0;
        auVar45._0_4_ = uVar37;
        auVar45._8_4_ = uVar37;
        auVar45._12_4_ = 0;
        puVar16 = coder->align_prices + local_1a8 * 0xb + -10;
        uVar42 = 0;
        auVar45 = auVar45 ^ _DAT_004efa70;
        do {
          auVar55._8_4_ = (int)uVar42;
          auVar55._0_8_ = uVar42;
          auVar55._12_4_ = (int)(uVar42 >> 0x20);
          auVar57 = (auVar55 | auVar60) ^ auVar61;
          iVar19 = auVar45._0_4_;
          bVar44 = iVar19 < auVar57._0_4_;
          iVar38 = auVar45._4_4_;
          iVar29 = auVar57._4_4_;
          if ((bool)(~(iVar38 < iVar29 || iVar29 == iVar38 && bVar44) & 1)) {
            puVar16[0x21] = 0x40000000;
          }
          if (iVar38 >= iVar29 && (iVar29 != iVar38 || !bVar44)) {
            puVar16[0x16] = 0x40000000;
          }
          auVar55 = (auVar55 | auVar59) ^ auVar61;
          iVar29 = auVar55._4_4_;
          if (iVar29 <= iVar38 && (iVar29 != iVar38 || auVar55._0_4_ <= iVar19)) {
            puVar16[0xb] = 0x40000000;
            *puVar16 = 0x40000000;
          }
          uVar42 = uVar42 + 4;
          puVar16 = puVar16 + -0x2c;
        } while (((ulong)uVar37 + 4 & 0xfffffffffffffffc) != uVar42);
        local_b8 = coder->is_rep0_long;
        local_e0 = (coder->rep_len_encoder).prices;
        lVar30 = 0;
        do {
          uVar37 = local_148[lVar30];
          if (1 < uVar37) {
            uVar6 = coder->is_rep0[uVar31] >> 4;
            if (lVar30 == 0) {
              bVar3 = lzma_rc_prices[uVar6];
              uVar42 = (ulong)(coder->is_rep0_long[uVar31][uVar34] >> 4) ^ 0x7f;
LAB_00414588:
              iVar19 = (uint)lzma_rc_prices[uVar42] + (uint)bVar3;
            }
            else {
              bVar3 = lzma_rc_prices[(ulong)uVar6 ^ 0x7f];
              uVar6 = coder->is_rep1[uVar31] >> 4;
              uVar42 = (ulong)uVar6;
              if (lVar30 == 1) goto LAB_00414588;
              iVar19 = (uint)lzma_rc_prices
                             [(2 - (uint32_t)lVar30 & 0x7f0 ^ (uint)coder->is_rep2[uVar31]) >> 4] +
                       (uint)lzma_rc_prices[(ulong)uVar6 ^ 0x7f] + (uint)bVar3;
            }
            puVar16 = (coder->rep_len_encoder).prices[uVar34] + (uVar37 - 2);
            do {
              uVar24 = *puVar16 + iVar19 + iVar15;
              if (uVar24 < coder->opts[uVar37].price) {
                coder->opts[uVar37].price = uVar24;
                coder->opts[uVar37].pos_prev = 0;
                coder->opts[uVar37].back_prev = (uint32_t)lVar30;
                coder->opts[uVar37].prev_1_is_literal = false;
              }
              uVar37 = uVar37 - 1;
              puVar16 = puVar16 + -1;
            } while (1 < uVar37);
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 != 4);
        uVar31 = 2;
        if (1 < local_148[0]) {
          uVar31 = (ulong)(local_148[0] + 1);
        }
        if ((uint)uVar31 <= uVar40) {
          bVar3 = lzma_rc_prices[uVar20];
          uVar20 = 0xffffffff;
          do {
            uVar20 = (ulong)((int)uVar20 + 1);
          } while (coder->matches[uVar20].len < (uint)uVar31);
          while( true ) {
            uVar40 = coder->matches[uVar20].dist;
            uVar37 = (uint)uVar31;
            uVar24 = 3;
            if (uVar37 < 6) {
              uVar24 = uVar37 - 2;
            }
            if ((ulong)uVar40 < 0x80) {
              uVar11 = coder->dist_prices[uVar24][uVar40];
            }
            else {
              sVar14 = 0x1e;
              if (-1 < (int)uVar40) {
                sVar14 = 0x12;
              }
              iVar15 = 0x3c;
              if (-1 < (int)uVar40) {
                iVar15 = 0x24;
              }
              if (uVar40 < 0x80000) {
                sVar14 = 6;
              }
              if (uVar40 < 0x80000) {
                iVar15 = 0xc;
              }
              uVar11 = coder->align_prices[uVar40 & 0xf] +
                       coder->dist_slot_prices[uVar24][(uint)""[uVar40 >> sVar14] + iVar15];
            }
            uVar24 = uVar11 + (uint)bVar3 + (uint)bVar4 +
                     (coder->match_len_encoder).prices[uVar34][uVar37 - 2];
            if (uVar24 < coder->opts[uVar31].price) {
              coder->opts[uVar31].price = uVar24;
              coder->opts[uVar31].pos_prev = 0;
              coder->opts[uVar31].back_prev = uVar40 + 4;
              coder->opts[uVar31].prev_1_is_literal = false;
            }
            uVar40 = coder->matches[uVar20].len;
            uVar24 = (int)uVar20 + 1;
            if ((uVar37 == uVar40) && (uVar24 == local_10c)) break;
            uVar42 = (ulong)uVar24;
            if (uVar37 != uVar40) {
              uVar42 = uVar20;
            }
            uVar31 = (ulong)(uVar37 + 1);
            uVar20 = uVar42;
          }
        }
        if (uVar23 == 0xffffffff) {
          return;
        }
        local_148[0] = (uint)*(undefined8 *)puVar17;
        local_148[1] = (uint)((ulong)*(undefined8 *)puVar17 >> 0x20);
        local_148[2] = (uint)*(undefined8 *)(coder->reps + 2);
        uStack_13c = (uint32_t)((ulong)*(undefined8 *)(coder->reps + 2) >> 0x20);
        local_68 = &coder->matches_count;
        local_a0 = coder->matches;
        local_90 = (coder->match_len_encoder).prices;
        local_38 = coder->dist_slot_prices;
        local_40 = coder->dist_prices;
        local_70 = coder->opts[1].backs;
        local_100 = &coder->opts[4].price;
        iVar15 = (int)local_b0;
        local_114 = 0xffe;
        local_120 = 0;
        uVar20 = 1;
        do {
          puVar17 = local_68;
          local_a8 = (ulong)(iVar15 + 1);
          if (local_120 == 0xfff) {
            __assert_fail("cur < OPTS",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lzma/lzma_encoder_optimum_normal.c"
                          ,0x348,
                          "void lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict, lzma_mf *restrict, uint32_t *restrict, uint32_t *restrict, uint32_t)"
                         );
          }
          uVar11 = lzma_mf_find(mf,local_68,local_a0);
          local_60 = (ulong)uVar11;
          coder->longest_match_length = uVar11;
          local_108 = (ulong)mf->nice_len;
          if (mf->nice_len <= uVar11) break;
          puVar8 = mf->buffer;
          uVar34 = mf->read_pos;
          local_ec = (mf->write_pos - uVar34) + 1;
          uVar11 = (uint32_t)uVar20;
          uVar40 = 0xfff - uVar11;
          if (local_ec < 0xfff - uVar11) {
            uVar40 = local_ec;
          }
          local_110 = *puVar17;
          plVar2 = &coder->opts[uVar20].state;
          uVar23 = coder->opts[uVar20].pos_prev;
          uVar31 = (ulong)uVar23;
          if (coder->opts[uVar20].prev_1_is_literal == true) {
            if (*(_Bool *)((long)plVar2 + 5) == true) {
              uVar42 = (ulong)plVar2[2];
              bVar43 = coder->opts[uVar42].state < STATE_LIT_MATCH;
              uVar23 = plVar2[3];
              bVar44 = !bVar43;
              iVar15 = (uint)bVar44 * 3 + 7;
              if (uVar23 < 4) {
                iVar15 = (uint)bVar44 * 3 + 8;
              }
              lVar18 = ((uint)bVar43 * 3 + iVar15) - STATE_SHORTREP_LIT;
              if (uVar20 != uVar31) {
                lVar25 = (uint)(STATE_SHORTREP_LIT < lVar18) * 3 + STATE_LIT_LONGREP;
                if (uVar23 < 4) goto LAB_00414854;
LAB_004148cb:
                local_148[0] = uVar23 - 4;
                uStack_13c = local_c0[uVar42 * 0xb + 2];
                local_148[1] = (uint)*(undefined8 *)(local_c0 + uVar42 * 0xb);
                local_148[2] = (uint)((ulong)*(undefined8 *)(local_c0 + uVar42 * 0xb) >> 0x20);
                goto LAB_0041491f;
              }
            }
            else {
              uVar23 = uVar23 - 1;
              lVar25 = coder->opts[uVar23].state;
              lVar18 = (lVar25 - STATE_SHORTREP_LIT) + (uint)(lVar25 < STATE_NONLIT_MATCH) * 3;
              if (lVar25 < STATE_MATCH_LIT) {
                lVar18 = STATE_LIT_LIT;
              }
              uVar42 = (ulong)uVar23;
              if (uVar20 != uVar31) goto LAB_0041483a;
            }
LAB_004147e3:
            if (plVar2[6] == 0) {
              lVar25 = (uint)(STATE_SHORTREP_LIT < lVar18) * 2 + STATE_LIT_SHORTREP;
            }
            else {
              lVar25 = (lVar18 - STATE_SHORTREP_LIT) + (uint)(lVar18 < STATE_NONLIT_MATCH) * 3;
              if (lVar18 < STATE_MATCH_LIT) {
                lVar25 = STATE_LIT_LIT;
              }
            }
          }
          else {
            lVar18 = coder->opts[uVar31].state;
            uVar42 = uVar31;
            if (uVar20 - 1 == uVar31) goto LAB_004147e3;
LAB_0041483a:
            uVar23 = plVar2[6];
            if (3 < uVar23) {
              lVar25 = (uint)(STATE_SHORTREP_LIT < lVar18) * 3 + STATE_LIT_MATCH;
              goto LAB_004148cb;
            }
            lVar25 = (uint)(STATE_SHORTREP_LIT < lVar18) * 3 + STATE_LIT_LONGREP;
LAB_00414854:
            local_148[0] = coder->opts[uVar42].backs[uVar23];
            if (uVar23 == 0) {
              uVar31 = 1;
              puVar17 = local_c0;
            }
            else {
              uVar31 = (ulong)(uVar23 + 1);
              memcpy(local_148 + 1,local_c0 + uVar42 * 0xb,uVar31 * 4 - 4);
              puVar17 = local_c0;
              if (2 < uVar23) goto LAB_0041491f;
            }
            do {
              local_148[uVar31] = *(uint32_t *)((long)puVar17 + (uVar42 * 0xb + uVar31) * 4);
              uVar31 = uVar31 + 1;
            } while ((int)uVar31 != 4);
          }
LAB_0041491f:
          puVar17 = local_70 + local_120 * 0xb;
          local_98 = puVar8 + uVar34;
          uVar37 = uVar11 + (int)local_b0;
          local_f8 = (ulong)uVar37;
          *plVar2 = lVar25;
          *puVar17 = local_148[0];
          *(ulong *)(puVar17 + 1) = CONCAT44(local_148[2],local_148[1]);
          puVar17[3] = uStack_13c;
          uVar22 = plVar2[4];
          bVar3 = local_98[-1];
          uVar31 = (ulong)local_148[0];
          bVar21 = local_98[-2 - uVar31];
          uVar23 = coder->pos_mask;
          uVar27 = uVar23 & uVar37;
          uVar6 = local_e8[lVar25][uVar27] >> 4;
          bVar4 = lzma_rc_prices[uVar6];
          uVar12 = get_literal_price(coder,uVar37,(uint)local_98[-2],STATE_SHORTREP_LIT < lVar25,
                                     (uint)bVar21,(uint)bVar3);
          uVar24 = uVar12 + uVar22 + (uint)bVar4;
          local_80 = uVar20 + 1;
          uVar37 = coder->opts[uVar20 + 1].price;
          bVar44 = uVar24 < uVar37;
          if (bVar44) {
            coder->opts[uVar20 + 1].price = uVar24;
            coder->opts[uVar20 + 1].pos_prev = uVar11;
            coder->opts[uVar20 + 1].back_prev = 0xffffffff;
            coder->opts[uVar20 + 1].prev_1_is_literal = false;
            uVar37 = uVar24;
          }
          auVar61 = _DAT_004efa70;
          auVar60 = _DAT_004efa60;
          auVar59 = _DAT_004efa50;
          iVar19 = uVar22 + lzma_rc_prices[(ulong)uVar6 ^ 0x7f];
          uVar42 = (ulong)(coder->is_rep[lVar25] >> 4);
          iVar15 = (uint)lzma_rc_prices[uVar42 ^ 0x7f] + iVar19;
          local_d8 = CONCAT44(local_d8._4_4_,iVar15);
          if ((bVar21 == bVar3) &&
             (((uVar20 <= coder->opts[uVar20 + 1].pos_prev ||
               (coder->opts[uVar20 + 1].back_prev != 0)) &&
              (uVar28 = (uint)lzma_rc_prices[local_b8[lVar25][uVar27] >> 4] +
                        (uint)lzma_rc_prices[coder->is_rep0[lVar25] >> 4] + iVar15, uVar28 <= uVar37
              )))) {
            coder->opts[uVar20 + 1].price = uVar28;
            coder->opts[uVar20 + 1].pos_prev = uVar11;
            coder->opts[uVar20 + 1].back_prev = 0;
            coder->opts[uVar20 + 1].prev_1_is_literal = false;
            bVar44 = true;
          }
          if (1 < uVar40) {
            psVar32 = (short *)(puVar8 + ((ulong)uVar34 - 1));
            uVar34 = (uint)local_108;
            uVar20 = local_108 & 0xffffffff;
            if (uVar40 < uVar34) {
              uVar20 = (ulong)uVar40;
            }
            uVar37 = (uint)uVar20;
            local_78 = uVar42;
            if (!(bool)(bVar21 == bVar3 | bVar44)) {
              uVar28 = uVar34 + 1;
              if (uVar40 <= uVar34 + 1) {
                uVar28 = uVar40;
              }
              if (uVar34 == 0xffffffff) {
LAB_00415d96:
                __assert_fail("len <= limit",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                              ,0x2e,
                              "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)"
                             );
              }
              uVar34 = uVar28;
              if (1 < uVar28) {
                uVar39 = 1;
LAB_00414bcb:
                uVar42 = *(long *)((long)psVar32 + (ulong)uVar39) -
                         *(long *)((long)psVar32 + (ulong)uVar39 + ~uVar31);
                if (uVar42 == 0) goto code_r0x00414bd7;
                uVar31 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                  }
                }
                uVar34 = ((uint)(uVar31 >> 3) & 0x1fffffff) + uVar39;
                if (uVar28 <= uVar34) {
                  uVar34 = uVar28;
                }
              }
LAB_00414bf0:
              if (uVar34 - 3 < 0xfffffffe) {
                uVar28 = (lVar25 - STATE_SHORTREP_LIT) + (uint)(lVar25 < STATE_NONLIT_MATCH) * 3;
                if (lVar25 < STATE_MATCH_LIT) {
                  uVar28 = 0;
                }
                uVar41 = (int)local_f8 + 1U & uVar23;
                uVar6 = local_e8[uVar28][uVar41];
                uVar7 = coder->is_rep[uVar28];
                uVar39 = uVar11 + uVar34;
                uVar31 = (ulong)uVar39;
                if ((uint)local_1a8 < uVar39) {
                  lVar30 = ~local_1a8 + uVar31;
                  auVar57._8_4_ = (int)lVar30;
                  auVar57._0_8_ = lVar30;
                  auVar57._12_4_ = (int)((ulong)lVar30 >> 0x20);
                  puVar17 = local_100 + local_1a8 * 0xb;
                  uVar42 = 0;
                  do {
                    auVar50._8_4_ = (int)uVar42;
                    auVar50._0_8_ = uVar42;
                    auVar50._12_4_ = (int)(uVar42 >> 0x20);
                    auVar45 = (auVar50 | auVar60) ^ auVar61;
                    iVar15 = SUB164(auVar57 ^ auVar61,0);
                    bVar44 = iVar15 < auVar45._0_4_;
                    iVar38 = SUB164(auVar57 ^ auVar61,4);
                    iVar29 = auVar45._4_4_;
                    if ((bool)(~(iVar38 < iVar29 || iVar29 == iVar38 && bVar44) & 1)) {
                      puVar17[-0x21] = 0x40000000;
                    }
                    if (iVar38 >= iVar29 && (iVar29 != iVar38 || !bVar44)) {
                      puVar17[-0x16] = 0x40000000;
                    }
                    auVar45 = (auVar50 | auVar59) ^ auVar61;
                    iVar29 = auVar45._4_4_;
                    if (iVar29 <= iVar38 && (iVar29 != iVar38 || auVar45._0_4_ <= iVar15)) {
                      puVar17[-0xb] = 0x40000000;
                      *puVar17 = 0x40000000;
                    }
                    uVar42 = uVar42 + 4;
                    puVar17 = puVar17 + 0x2c;
                  } while ((((uVar34 + uVar11) - local_1a8) + 3 & 0xfffffffffffffffc) != uVar42);
                  local_1a8 = (ulong)uVar39;
                }
                uVar34 = uVar24 + lzma_rc_prices[(ulong)(uVar6 >> 4) ^ 0x7f] +
                         (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                         local_e0[uVar41][uVar34 - 3] +
                         (uint)lzma_rc_prices[(ulong)(local_b8[uVar28][uVar41] >> 4) ^ 0x7f] +
                         (uint)lzma_rc_prices[coder->is_rep0[uVar28] >> 4];
                if (uVar34 < coder->opts[uVar31].price) {
                  coder->opts[uVar31].price = uVar34;
                  coder->opts[uVar31].pos_prev = (uint32_t)local_80;
                  coder->opts[uVar31].back_prev = 0;
                  coder->opts[uVar31].prev_1_is_literal = true;
                  coder->opts[uVar31].prev_2 = false;
                }
              }
            }
            local_98 = local_98 + -2;
            sVar5 = *psVar32;
            local_58 = local_b8[lVar25] + uVar27;
            local_d0 = local_e0 + uVar27;
            local_168 = 2;
            local_50 = (long)*local_e8 +
                       (ulong)(((uint)(STATE_SHORTREP_LIT < lVar25) * 3 + 8) * 0x20);
            lVar30 = 0;
            do {
              psVar13 = (short *)(local_98 + -(ulong)local_148[lVar30]);
              if (sVar5 == *psVar13) {
                if (uVar37 < 2) goto LAB_00415d96;
                uVar31 = 2;
                if (2 < uVar37) {
                  uVar34 = 2;
LAB_00414ed5:
                  uVar31 = *(long *)((long)psVar32 + (ulong)uVar34) -
                           *(long *)((long)psVar13 + (ulong)uVar34);
                  if (uVar31 == 0) goto code_r0x00414ee1;
                  uVar42 = 0;
                  if (uVar31 != 0) {
                    for (; (uVar31 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                    }
                  }
                  uVar34 = ((uint)(uVar42 >> 3) & 0x1fffffff) + uVar34;
                  uVar31 = (ulong)uVar34;
                  if (uVar37 <= uVar34) {
                    uVar31 = uVar20;
                  }
                }
LAB_00414efe:
                iVar15 = (int)uVar31;
                uVar24 = iVar15 + uVar11;
                local_c8 = (ulong)uVar24;
                uVar34 = (uint)local_1a8;
                if ((uint)local_1a8 < uVar24) {
                  lVar35 = ~local_1a8 + (ulong)uVar24;
                  auVar46._8_4_ = (int)lVar35;
                  auVar46._0_8_ = lVar35;
                  auVar46._12_4_ = (int)((ulong)lVar35 >> 0x20);
                  puVar17 = local_100 + local_1a8 * 0xb;
                  uVar42 = 0;
                  do {
                    auVar51._8_4_ = (int)uVar42;
                    auVar51._0_8_ = uVar42;
                    auVar51._12_4_ = (int)(uVar42 >> 0x20);
                    auVar45 = (auVar51 | auVar60) ^ auVar61;
                    iVar38 = SUB164(auVar46 ^ auVar61,0);
                    bVar44 = iVar38 < auVar45._0_4_;
                    iVar29 = SUB164(auVar46 ^ auVar61,4);
                    iVar56 = auVar45._4_4_;
                    if ((bool)(~(iVar29 < iVar56 || iVar56 == iVar29 && bVar44) & 1)) {
                      puVar17[-0x21] = 0x40000000;
                    }
                    if (iVar29 >= iVar56 && (iVar56 != iVar29 || !bVar44)) {
                      puVar17[-0x16] = 0x40000000;
                    }
                    auVar45 = (auVar51 | auVar59) ^ auVar61;
                    iVar56 = auVar45._4_4_;
                    if (iVar56 <= iVar29 && (iVar56 != iVar29 || auVar45._0_4_ <= iVar38)) {
                      puVar17[-0xb] = 0x40000000;
                      *puVar17 = 0x40000000;
                    }
                    uVar42 = uVar42 + 4;
                    puVar17 = puVar17 + 0x2c;
                    uVar34 = uVar24;
                  } while ((((iVar15 + uVar11) - local_1a8) + 3 & 0xfffffffffffffffc) != uVar42);
                }
                uVar6 = coder->is_rep0[lVar25] >> 4;
                uVar22 = (uint32_t)lVar30;
                if (lVar30 == 0) {
                  bVar3 = lzma_rc_prices[uVar6];
                  uVar42 = (ulong)(*local_58 >> 4) ^ 0x7f;
LAB_0041509e:
                  iVar38 = (uint)lzma_rc_prices[uVar42] + (uint)bVar3;
                }
                else {
                  bVar3 = lzma_rc_prices[(ulong)uVar6 ^ 0x7f];
                  uVar6 = coder->is_rep1[lVar25] >> 4;
                  uVar42 = (ulong)uVar6;
                  if (lVar30 == 1) goto LAB_0041509e;
                  iVar38 = (uint)lzma_rc_prices
                                 [(2 - uVar22 & 0x7f0 ^ (uint)coder->is_rep2[lVar25]) >> 4] +
                           (uint)lzma_rc_prices[(ulong)uVar6 ^ 0x7f] + (uint)bVar3;
                }
                iVar38 = iVar38 + (int)local_d8;
                puVar17 = *local_d0 + (iVar15 - 2U);
                uVar42 = uVar31;
                do {
                  uVar24 = *puVar17 + iVar38;
                  uVar28 = (int)uVar42 + uVar11;
                  if (uVar24 < coder->opts[uVar28].price) {
                    coder->opts[uVar28].price = uVar24;
                    coder->opts[uVar28].pos_prev = uVar11;
                    coder->opts[uVar28].back_prev = uVar22;
                    coder->opts[uVar28].prev_1_is_literal = false;
                  }
                  uVar24 = (int)uVar42 - 1;
                  uVar42 = (ulong)uVar24;
                  puVar17 = puVar17 + -1;
                } while (1 < uVar24);
                uVar42 = uVar31 + 1;
                uVar24 = (uint)uVar42;
                if (lVar30 == 0) {
                  local_168 = uVar42;
                }
                local_168 = local_168 & 0xffffffff;
                uVar28 = (int)local_108 + uVar24;
                uVar39 = uVar40;
                if (uVar28 < uVar40) {
                  uVar39 = uVar28;
                }
                uVar41 = uVar24;
                if (uVar24 < uVar39) {
                  if (local_114 < uVar28) {
                    uVar28 = local_114;
                  }
                  if (local_ec <= uVar28) {
                    uVar28 = local_ec;
                  }
                  iVar29 = 0;
                  psVar33 = psVar32;
                  psVar36 = psVar13;
                  do {
                    if (*(char *)((long)psVar33 + uVar42) != *(char *)((long)psVar36 + uVar42)) {
                      uVar41 = uVar24 + iVar29;
                      break;
                    }
                    iVar29 = iVar29 + 1;
                    psVar36 = (short *)((long)psVar36 + 1);
                    psVar33 = (short *)((long)psVar33 + 1);
                    uVar41 = uVar39;
                  } while ((uVar24 - uVar28) + iVar29 != 0);
                }
                if (1 < uVar41 - uVar24) {
                  uVar28 = iVar15 + (int)local_f8;
                  uVar12 = (*local_d0)[iVar15 - 2U];
                  local_84 = (uint)lzma_rc_prices
                                   [*(ushort *)(local_50 + (ulong)(uVar28 & uVar23) * 2) >> 4];
                  local_48 = (ulong)(uVar41 - uVar24);
                  local_88 = get_literal_price(coder,uVar28,
                                               (uint)*(byte *)((long)psVar32 + (ulong)(iVar15 - 1)),
                                               true,(uint)*(byte *)((long)psVar13 + uVar31),
                                               (uint)*(byte *)((long)psVar32 + uVar31));
                  auVar61 = _DAT_004efa70;
                  auVar60 = _DAT_004efa60;
                  auVar59 = _DAT_004efa50;
                  uVar24 = iVar15 + (int)local_f8 + 1U & uVar23;
                  uVar6 = coder->is_match[5][uVar24];
                  uVar7 = coder->is_rep[5];
                  uVar28 = (int)local_48 + (int)local_c8 + 1;
                  if (uVar34 < uVar28) {
                    lVar35 = ~(ulong)uVar34 + (ulong)uVar28;
                    uVar31 = (ulong)(iVar15 + uVar11);
                    if (iVar15 + uVar11 < local_1a8) {
                      uVar31 = local_1a8;
                    }
                    auVar47._8_4_ = (int)lVar35;
                    auVar47._0_8_ = lVar35;
                    auVar47._12_4_ = (int)((ulong)lVar35 >> 0x20);
                    puVar17 = local_100 + uVar31 * 0xb;
                    uVar42 = 0;
                    do {
                      auVar52._8_4_ = (int)uVar42;
                      auVar52._0_8_ = uVar42;
                      auVar52._12_4_ = (int)(uVar42 >> 0x20);
                      auVar45 = (auVar52 | auVar60) ^ auVar61;
                      iVar15 = SUB164(auVar47 ^ auVar61,0);
                      bVar44 = iVar15 < auVar45._0_4_;
                      iVar29 = SUB164(auVar47 ^ auVar61,4);
                      iVar56 = auVar45._4_4_;
                      if ((bool)(~(iVar29 < iVar56 || iVar56 == iVar29 && bVar44) & 1)) {
                        puVar17[-0x21] = 0x40000000;
                      }
                      if (iVar29 >= iVar56 && (iVar56 != iVar29 || !bVar44)) {
                        puVar17[-0x16] = 0x40000000;
                      }
                      auVar45 = (auVar52 | auVar59) ^ auVar61;
                      iVar56 = auVar45._4_4_;
                      if (iVar56 <= iVar29 && (iVar56 != iVar29 || auVar45._0_4_ <= iVar15)) {
                        puVar17[-0xb] = 0x40000000;
                        *puVar17 = 0x40000000;
                      }
                      uVar42 = uVar42 + 4;
                      puVar17 = puVar17 + 0x2c;
                      uVar34 = uVar28;
                    } while ((((uVar41 + uVar11) - uVar31) + 3 & 0xfffffffffffffffc) != uVar42);
                  }
                  uVar24 = uVar12 + iVar38 + local_88 + local_84 +
                           (uint)lzma_rc_prices[(ulong)(uVar6 >> 4) ^ 0x7f] +
                           (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                           local_e0[uVar24][(int)local_48 - 2] +
                           (uint)lzma_rc_prices[(ulong)(coder->is_rep0_long[5][uVar24] >> 4) ^ 0x7f]
                           + (uint)lzma_rc_prices[coder->is_rep0[5] >> 4];
                  if (uVar24 < coder->opts[uVar28].price) {
                    coder->opts[uVar28].price = uVar24;
                    coder->opts[uVar28].pos_prev = (int)local_c8 + 1;
                    coder->opts[uVar28].back_prev = 0;
                    coder->opts[uVar28].prev_1_is_literal = true;
                    coder->opts[uVar28].prev_2 = true;
                    coder->opts[uVar28].pos_prev_2 = uVar11;
                    coder->opts[uVar28].back_prev_2 = uVar22;
                  }
                }
                local_1a8 = (ulong)uVar34;
              }
              lVar30 = lVar30 + 1;
            } while (lVar30 != 4);
            uVar34 = (uint)local_60;
            uVar24 = local_110;
            uVar28 = uVar34;
            if (uVar37 < uVar34) {
              uVar24 = 0;
              do {
                uVar28 = uVar24;
                uVar24 = uVar28 + 1;
              } while (local_a0[uVar28].len < uVar37);
              local_a0[uVar28].len = uVar37;
              uVar28 = uVar37;
            }
            if ((uint)local_168 <= uVar28) {
              uVar28 = uVar28 + uVar11;
              uVar37 = (uint)local_108;
              if ((uint)local_1a8 < uVar28) {
                lVar30 = ~local_1a8 + (ulong)uVar28;
                if (uVar37 <= uVar34) {
                  uVar34 = uVar37;
                }
                if (local_114 <= uVar34) {
                  uVar34 = local_114;
                }
                if (local_ec <= uVar34) {
                  uVar34 = local_ec;
                }
                auVar48._8_4_ = (int)lVar30;
                auVar48._0_8_ = lVar30;
                auVar48._12_4_ = (int)((ulong)lVar30 >> 0x20);
                puVar17 = local_100 + local_1a8 * 0xb;
                uVar20 = 0;
                do {
                  auVar53._8_4_ = (int)uVar20;
                  auVar53._0_8_ = uVar20;
                  auVar53._12_4_ = (int)(uVar20 >> 0x20);
                  auVar45 = (auVar53 | auVar60) ^ auVar61;
                  iVar15 = SUB164(auVar48 ^ auVar61,0);
                  bVar44 = iVar15 < auVar45._0_4_;
                  iVar38 = SUB164(auVar48 ^ auVar61,4);
                  iVar29 = auVar45._4_4_;
                  if ((bool)(~(iVar38 < iVar29 || iVar29 == iVar38 && bVar44) & 1)) {
                    puVar17[-0x21] = 0x40000000;
                  }
                  if (iVar38 >= iVar29 && (iVar29 != iVar38 || !bVar44)) {
                    puVar17[-0x16] = 0x40000000;
                  }
                  auVar45 = (auVar53 | auVar59) ^ auVar61;
                  iVar29 = auVar45._4_4_;
                  if (iVar29 <= iVar38 && (iVar29 != iVar38 || auVar45._0_4_ <= iVar15)) {
                    puVar17[-0xb] = 0x40000000;
                    *puVar17 = 0x40000000;
                  }
                  uVar20 = uVar20 + 4;
                  puVar17 = puVar17 + 0x2c;
                } while ((((uVar34 + uVar11) - local_1a8) + 3 & 0xfffffffffffffffc) != uVar20);
                local_1a8 = (ulong)uVar28;
              }
              bVar3 = lzma_rc_prices[local_78];
              uVar20 = 0xffffffff;
              do {
                uVar20 = (ulong)((int)uVar20 + 1);
              } while (local_a0[uVar20].len < (uint)local_168);
              local_108 = (ulong)(uVar37 + 1);
              local_f8 = (long)*local_e8 +
                         (ulong)(((uint)(STATE_SHORTREP_LIT < lVar25) * 3 + 7) * 0x20);
              uVar31 = local_168;
              local_110 = uVar24;
              do {
                uVar34 = local_a0[uVar20].dist;
                uVar42 = (ulong)uVar34;
                iVar15 = 0x3c;
                if (-1 < (int)uVar34) {
                  iVar15 = 0x24;
                }
                sVar14 = 0x1e;
                if (-1 < (int)uVar34) {
                  sVar14 = 0x12;
                }
                if (uVar34 < 0x80000) {
                  iVar15 = 0xc;
                  sVar14 = 6;
                }
                uVar22 = local_a0[uVar20].len;
                uVar37 = (uint)uVar31;
                iVar38 = 0;
                while( true ) {
                  uVar39 = uVar37 + iVar38;
                  uVar28 = (uVar37 - 2) + iVar38;
                  uVar24 = 3;
                  if (uVar39 < 6) {
                    uVar24 = uVar28;
                  }
                  if (uVar34 < 0x80) {
                    uVar12 = local_40[uVar24][uVar42];
                  }
                  else {
                    uVar12 = coder->align_prices[uVar34 & 0xf] +
                             local_38[uVar24][(uint)""[uVar34 >> sVar14] + iVar15];
                  }
                  uVar41 = uVar12 + iVar19 + (uint)bVar3 + local_90[uVar27][(uVar37 - 2) + iVar38];
                  uVar24 = (int)local_120 + uVar37 + iVar38 + 1;
                  if (uVar41 < coder->opts[uVar24].price) {
                    coder->opts[uVar24].price = uVar41;
                    coder->opts[uVar24].pos_prev = uVar11;
                    coder->opts[uVar24].back_prev = uVar34 + 4;
                    coder->opts[uVar24].prev_1_is_literal = false;
                  }
                  if (uVar28 + 2 == uVar22) break;
                  iVar38 = iVar38 + 1;
                }
                local_168 = (ulong)((int)local_168 + iVar38 + 1);
                uVar28 = uVar37 + iVar38 + 1;
                uVar24 = (int)local_108 + uVar39;
                if (uVar40 <= uVar24) {
                  uVar24 = uVar40;
                }
                uVar31 = (ulong)uVar28;
                if (uVar28 < uVar24) {
                  uVar31 = local_168;
                  do {
                    if (*(uint8_t *)((long)psVar32 + uVar31) != local_98[uVar31 - uVar42]) break;
                    uVar31 = uVar31 + 1;
                  } while (uVar31 < uVar24);
                }
                iVar15 = (int)uVar31;
                uVar24 = (~uVar37 + iVar15) - iVar38;
                if (1 < uVar24) {
                  uVar26 = (int)local_a8 + uVar39;
                  local_d8 = (ulong)(uVar26 & uVar23);
                  local_c8 = CONCAT44(local_c8._4_4_,
                                      (uint)lzma_rc_prices
                                            [*(ushort *)(local_f8 + local_d8 * 2) >> 4]);
                  uVar22 = get_literal_price(coder,uVar26,
                                             (uint)*(byte *)((long)psVar32 +
                                                            (ulong)((uVar37 + iVar38) - 1)),true,
                                             (uint)local_98[uVar39 - uVar42],
                                             (uint)*(byte *)((long)psVar32 + (ulong)uVar39));
                  auVar61 = _DAT_004efa70;
                  auVar60 = _DAT_004efa60;
                  auVar59 = _DAT_004efa50;
                  local_d0 = (uint32_t (*) [272])CONCAT44(local_d0._4_4_,uVar22);
                  uVar26 = (int)local_d8 + 1U & uVar23;
                  uVar6 = coder->is_match[4][uVar26];
                  uVar7 = coder->is_rep[4];
                  uVar24 = uVar24 + (int)local_120 + uVar39 + 2;
                  uVar31 = (ulong)uVar24;
                  if ((uint)local_1a8 < uVar24) {
                    lVar30 = ~local_1a8 + uVar31;
                    auVar49._8_4_ = (int)lVar30;
                    auVar49._0_8_ = lVar30;
                    auVar49._12_4_ = (int)((ulong)lVar30 >> 0x20);
                    puVar17 = local_100 + local_1a8 * 0xb;
                    uVar42 = 0;
                    do {
                      auVar54._8_4_ = (int)uVar42;
                      auVar54._0_8_ = uVar42;
                      auVar54._12_4_ = (int)(uVar42 >> 0x20);
                      auVar45 = (auVar54 | auVar60) ^ auVar61;
                      iVar29 = SUB164(auVar49 ^ auVar61,0);
                      bVar44 = iVar29 < auVar45._0_4_;
                      iVar56 = SUB164(auVar49 ^ auVar61,4);
                      iVar58 = auVar45._4_4_;
                      if ((bool)(~(iVar56 < iVar58 || iVar58 == iVar56 && bVar44) & 1)) {
                        puVar17[-0x21] = 0x40000000;
                      }
                      if (iVar56 >= iVar58 && (iVar58 != iVar56 || !bVar44)) {
                        puVar17[-0x16] = 0x40000000;
                      }
                      auVar45 = (auVar54 | auVar59) ^ auVar61;
                      iVar58 = auVar45._4_4_;
                      if (iVar58 <= iVar56 && (iVar58 != iVar56 || auVar45._0_4_ <= iVar29)) {
                        puVar17[-0xb] = 0x40000000;
                        *puVar17 = 0x40000000;
                      }
                      uVar42 = uVar42 + 4;
                      puVar17 = puVar17 + 0x2c;
                    } while ((((uVar11 + iVar15) - local_1a8) + 3 & 0xfffffffffffffffc) != uVar42);
                    local_1a8 = (ulong)uVar24;
                  }
                  uVar37 = uVar41 + (int)local_c8 + uVar22 +
                           (uint)lzma_rc_prices[(ulong)(uVar7 >> 4) ^ 0x7f] +
                           (uint)lzma_rc_prices[(ulong)(uVar6 >> 4) ^ 0x7f] +
                           local_e0[uVar26][((iVar15 - uVar37) - iVar38) - 3] +
                           (uint)lzma_rc_prices[(ulong)(coder->is_rep0_long[4][uVar26] >> 4) ^ 0x7f]
                           + (uint)lzma_rc_prices[coder->is_rep0[4] >> 4];
                  if (uVar37 < coder->opts[uVar31].price) {
                    coder->opts[uVar31].price = uVar37;
                    coder->opts[uVar31].pos_prev = (int)local_120 + uVar39 + 2;
                    coder->opts[uVar31].back_prev = 0;
                    coder->opts[uVar31].prev_1_is_literal = true;
                    coder->opts[uVar31].prev_2 = true;
                    coder->opts[uVar31].pos_prev_2 = uVar11;
                    coder->opts[uVar31].back_prev_2 = uVar34 + 4;
                  }
                }
                uVar31 = (ulong)uVar28;
                uVar34 = (int)uVar20 + 1;
                uVar20 = (ulong)uVar34;
              } while (uVar34 != local_110);
            }
          }
          local_120 = local_120 + 1;
          local_114 = local_114 - 1;
          iVar15 = (int)local_a8;
          uVar20 = local_80;
        } while (local_80 < local_1a8);
        coder->opts_end_index = (uint32_t)uVar20;
        uVar34 = coder->opts[uVar20 & 0xffffffff].pos_prev;
        uVar11 = coder->opts[uVar20 & 0xffffffff].back_prev;
        do {
          uVar42 = (ulong)uVar34;
          uVar31 = uVar20 & 0xffffffff;
          if (coder->opts[uVar31].prev_1_is_literal == false) {
            uVar40 = coder->opts[uVar42].pos_prev;
            uVar22 = coder->opts[uVar42].back_prev;
          }
          else {
            coder->opts[uVar42].prev_1_is_literal = false;
            uVar40 = uVar34 - 1;
            uVar22 = 0xffffffff;
            if (coder->opts[uVar31].prev_2 == true) {
              coder->opts[uVar40].prev_1_is_literal = false;
              uVar12 = coder->opts[uVar31].back_prev_2;
              coder->opts[uVar40].pos_prev = coder->opts[uVar31].pos_prev_2;
              coder->opts[uVar40].back_prev = uVar12;
            }
          }
          coder->opts[uVar42].back_prev = uVar11;
          coder->opts[uVar42].pos_prev = (uint32_t)uVar20;
          bVar44 = uVar34 != 0;
          uVar20 = uVar42;
          uVar34 = uVar40;
          uVar11 = uVar22;
        } while (bVar44);
        uVar34 = coder->opts[0].pos_prev;
        coder->opts_current_index = uVar34;
        *local_128 = uVar34;
        uVar22 = coder->opts[0].back_prev;
        goto LAB_00414020;
      }
      *local_130 = uVar22;
      goto LAB_00414160;
    }
  }
  *local_130 = 0xffffffff;
LAB_00414160:
  *local_128 = 1;
  return;
code_r0x004140c5:
  uVar31 = uVar31 + 8;
  if (uVar23 <= uVar31) goto LAB_004140f3;
  goto LAB_004140b9;
code_r0x00414bd7:
  uVar39 = uVar39 + 8;
  if (uVar28 <= uVar39) goto LAB_00414bf0;
  goto LAB_00414bcb;
code_r0x00414ee1:
  uVar34 = uVar34 + 8;
  uVar31 = uVar20;
  if (uVar37 <= uVar34) goto LAB_00414efe;
  goto LAB_00414ed5;
}

Assistant:

extern void
lzma_lzma_optimum_normal(lzma_lzma1_encoder *restrict coder,
		lzma_mf *restrict mf,
		uint32_t *restrict back_res, uint32_t *restrict len_res,
		uint32_t position)
{
	// If we have symbols pending, return the next pending symbol.
	if (coder->opts_end_index != coder->opts_current_index) {
		assert(mf->read_ahead > 0);
		*len_res = coder->opts[coder->opts_current_index].pos_prev
				- coder->opts_current_index;
		*back_res = coder->opts[coder->opts_current_index].back_prev;
		coder->opts_current_index = coder->opts[
				coder->opts_current_index].pos_prev;
		return;
	}

	// Update the price tables. In LZMA SDK <= 4.60 (and possibly later)
	// this was done in both initialization function and in the main loop.
	// In liblzma they were moved into this single place.
	if (mf->read_ahead == 0) {
		if (coder->match_price_count >= (1 << 7))
			fill_dist_prices(coder);

		if (coder->align_price_count >= ALIGN_SIZE)
			fill_align_prices(coder);
	}

	// TODO: This needs quite a bit of cleaning still. But splitting
	// the original function into two pieces makes it at least a little
	// more readable, since those two parts don't share many variables.

	uint32_t len_end = helper1(coder, mf, back_res, len_res, position);
	if (len_end == UINT32_MAX)
		return;

	uint32_t reps[REPS];
	memcpy(reps, coder->reps, sizeof(reps));

	uint32_t cur;
	for (cur = 1; cur < len_end; ++cur) {
		assert(cur < OPTS);

		coder->longest_match_length = mf_find(
				mf, &coder->matches_count, coder->matches);

		if (coder->longest_match_length >= mf->nice_len)
			break;

		len_end = helper2(coder, reps, mf_ptr(mf) - 1, len_end,
				position + cur, cur, mf->nice_len,
				my_min(mf_avail(mf) + 1, OPTS - 1 - cur));
	}

	backward(coder, len_res, back_res, cur);
	return;
}